

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O0

void xlfparser::_infer_token_subtypes<wchar_t>
               (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens,
               Options<wchar_t> *options,wchar_t *formula,size_t size)

{
  bool bVar1;
  wchar_t wVar2;
  syntax_option_type __f;
  Type TVar3;
  wchar_t wVar4;
  Subtype SVar5;
  wostream *pwVar6;
  optional<wchar_t> *this;
  size_t sVar7;
  out_of_range *this_00;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_268;
  Token *local_260;
  Token *previous_1;
  __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_250;
  type local_241;
  __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_240;
  Token *local_238;
  Token *previous;
  __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_228;
  type local_219;
  Token *local_218;
  Token *token;
  __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_208;
  iterator iter;
  undefined1 local_1e0 [8];
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> number_re;
  wstringstream local_1b0 [8];
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> number_re_ss;
  wostream local_1a0 [376];
  size_t local_28;
  size_t size_local;
  wchar_t *formula_local;
  Options<wchar_t> *options_local;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens_local;
  
  local_28 = size;
  size_local = (size_t)formula;
  formula_local = (wchar_t *)options;
  options_local = (Options<wchar_t> *)tokens;
  std::__cxx11::wstringstream::wstringstream(local_1b0);
  pwVar6 = std::operator<<(local_1a0,"^\\d+(\\");
  this = (optional<wchar_t> *)(formula_local + 10);
  number_re._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = _choose_char<wchar_t>('.',L'.');
  wVar2 = std::optional<wchar_t>::value_or<wchar_t>
                    (this,(wchar_t *)
                          &number_re._M_automaton.
                           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
  pwVar6 = std::operator<<(pwVar6,wVar2);
  std::operator<<(pwVar6,"\\d+)?(E[+-]\\d+)?$");
  std::__cxx11::wstringstream::str();
  __f = Catch::clara::std::regex_constants::operator|(0x10,1);
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)local_1e0,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&iter,__f
            );
  std::__cxx11::wstring::~wstring((wstring *)&iter);
  local_208._M_current =
       (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::begin
                          ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                           options_local);
  do {
    token = (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::end
                               ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                                options_local);
    bVar1 = __gnu_cxx::
            operator==<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                      (&local_208,
                       (__normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                        *)&token);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)local_1e0);
      std::__cxx11::wstringstream::~wstringstream(local_1b0);
      return;
    }
    local_218 = __gnu_cxx::
                __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                ::operator*(&local_208);
    sVar7 = Token::start(local_218);
    if ((local_28 <= sVar7) || (sVar7 = Token::end(local_218), local_28 <= sVar7)) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Token index out of range");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    TVar3 = Token::type(local_218);
    sVar7 = size_local;
    if (TVar3 == OperatorInfix) {
      sVar8 = Token::start(local_218);
      wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
      wVar4 = _choose_char<wchar_t>('-',L'-');
      sVar7 = size_local;
      if (wVar2 != wVar4) {
        sVar8 = Token::start(local_218);
        wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
        wVar4 = _choose_char<wchar_t>('+',L'+');
        if (wVar2 != wVar4) goto LAB_001f0f76;
      }
      local_228._M_current =
           (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::begin
                              ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                               options_local);
      local_219 = (type)__gnu_cxx::
                        operator<=><xlfparser::Token*,std::vector<xlfparser::Token,std::allocator<xlfparser::Token>>>
                                  (&local_208,&local_228);
      Catch::clara::std::__cmp_cat::__unspec::__unspec
                ((__unspec *)((long)&previous + 7),(__unspec *)0x0);
      bVar1 = std::operator>(local_219);
      if (bVar1) {
        local_240 = __gnu_cxx::
                    __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                    ::operator-(&local_208,1);
        local_238 = __gnu_cxx::
                    __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                    ::operator*(&local_240);
        TVar3 = Token::type(local_238);
        if ((((TVar3 == Function) && (SVar5 = Token::subtype(local_238), SVar5 == Stop)) ||
            ((TVar3 = Token::type(local_238), TVar3 == Subexpression &&
             (SVar5 = Token::subtype(local_238), SVar5 == Stop)))) ||
           ((TVar3 = Token::type(local_238), TVar3 == OperatorPostfix ||
            (TVar3 = Token::type(local_238), TVar3 == Operand)))) {
          Token::subtype(local_218,Math);
          goto LAB_001f13a5;
        }
      }
      Token::type(local_218,OperatorPrefix);
      Token::subtype(local_218,Math);
    }
    else {
LAB_001f0f76:
      TVar3 = Token::type(local_218);
      sVar7 = size_local;
      if (TVar3 == OperatorInfix) {
        sVar8 = Token::start(local_218);
        wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
        wVar4 = _choose_char<wchar_t>('+',L'+');
        if (wVar2 == wVar4) {
          local_250._M_current =
               (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::begin
                                  ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                                   options_local);
          local_241 = (type)__gnu_cxx::
                            operator<=><xlfparser::Token*,std::vector<xlfparser::Token,std::allocator<xlfparser::Token>>>
                                      (&local_208,&local_250);
          Catch::clara::std::__cmp_cat::__unspec::__unspec
                    ((__unspec *)((long)&previous_1 + 7),(__unspec *)0x0);
          bVar1 = std::operator>(local_241);
          if (bVar1) {
            local_268 = __gnu_cxx::
                        __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                        ::operator-(&local_208,1);
            local_260 = __gnu_cxx::
                        __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                        ::operator*(&local_268);
            TVar3 = Token::type(local_260);
            if ((((TVar3 == Function) && (SVar5 = Token::subtype(local_260), SVar5 == Stop)) ||
                ((TVar3 = Token::type(local_260), TVar3 == Subexpression &&
                 (SVar5 = Token::subtype(local_260), SVar5 == Stop)))) ||
               ((TVar3 = Token::type(local_260), TVar3 == OperatorPostfix ||
                (TVar3 = Token::type(local_260), TVar3 == Operand)))) {
              Token::subtype(local_218,Math);
              goto LAB_001f13a5;
            }
          }
          Token::type(local_218,OperatorPrefix);
          Token::subtype(local_218,Math);
          goto LAB_001f13a5;
        }
      }
      TVar3 = Token::type(local_218);
      sVar7 = size_local;
      if (TVar3 == OperatorInfix) {
        sVar8 = Token::start(local_218);
        wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
        wVar4 = _choose_char<wchar_t>('@',L'@');
        if (wVar2 == wVar4) {
          Token::type(local_218,OperatorPrefix);
          Token::subtype(local_218,Intersection);
        }
      }
      TVar3 = Token::type(local_218);
      if ((TVar3 == OperatorInfix) &&
         (SVar5 = Token::subtype(local_218), sVar7 = size_local, SVar5 == None)) {
        sVar8 = Token::start(local_218);
        wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
        wVar4 = _choose_char<wchar_t>('<',L'<');
        sVar7 = size_local;
        if (wVar2 != wVar4) {
          sVar8 = Token::start(local_218);
          wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
          wVar4 = _choose_char<wchar_t>('>',L'>');
          sVar7 = size_local;
          if (wVar2 != wVar4) {
            sVar8 = Token::start(local_218);
            wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
            wVar4 = _choose_char<wchar_t>('=',L'=');
            sVar7 = size_local;
            if (wVar2 != wVar4) {
              sVar8 = Token::start(local_218);
              wVar2 = *(wchar_t *)(sVar7 + sVar8 * 4);
              wVar4 = _choose_char<wchar_t>('&',L'&');
              if (wVar2 == wVar4) {
                Token::subtype(local_218,Concatenation);
              }
              else {
                Token::subtype(local_218,Math);
              }
              goto LAB_001f13a5;
            }
          }
        }
        Token::subtype(local_218,Logical);
      }
      else {
        TVar3 = Token::type(local_218);
        if ((TVar3 == Operand) &&
           (SVar5 = Token::subtype(local_218), sVar7 = size_local, SVar5 == None)) {
          sVar9 = Token::start(local_218);
          sVar8 = size_local;
          sVar10 = Token::end(local_218);
          bVar1 = std::regex_match<wchar_t_const*,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                            ((wchar_t *)(sVar7 + sVar9 * 4),(wchar_t *)(sVar8 + 4 + sVar10 * 4),
                             (basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)local_1e0
                             ,0);
          if (bVar1) {
            Token::subtype(local_218,Number);
          }
          else {
            Token::subtype(local_218,Range);
          }
        }
      }
    }
LAB_001f13a5:
    __gnu_cxx::
    __normal_iterator<xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
    ::operator++(&local_208);
  } while( true );
}

Assistant:

inline void _infer_token_subtypes(std::vector<Token>& tokens,
                                      const Options<char_type>& options,
                                      const char_type* formula,
                                      size_t size)
    {
        std::basic_stringstream<char_type> number_re_ss;
        number_re_ss << R"(^\d+(\)" << options.decimal_separator.value_or(XLFP_CHAR('.')) << R"(\d+)?(E[+-]\d+)?$)";
        const std::basic_regex<char_type> number_re(number_re_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        for (auto iter = tokens.begin(); iter != tokens.end(); ++iter)
        {
            auto& token = *iter;

            if (token.start() >= size || token.end() >= size)
                throw std::out_of_range("Token index out of range");

            if (token.type() == Token::Type::OperatorInfix && (
                    formula[token.start()] == XLFP_CHAR('-') ||
                    formula[token.start()] == XLFP_CHAR('+')))
            {
                // If the previous token was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('+'))
            {
                // If the previous token  was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('@'))
            {
                // Implicit intersection operator is always a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Intersection);
            }

            if (token.type() == Token::Type::OperatorInfix && token.subtype() == Token::Subtype::None)
            {
                if (formula[token.start()] == XLFP_CHAR('<') ||
                    formula[token.start()] == XLFP_CHAR('>') ||
                    formula[token.start()] == XLFP_CHAR('='))
                {
                    token.subtype(Token::Subtype::Logical);
                }
                else if (formula[token.start()] == XLFP_CHAR('&'))
                {
                    token.subtype(Token::Subtype::Concatenation);
                }
                else
                {
                    token.subtype(Token::Subtype::Math);
                }

                continue;
            }

            // Set the operand type to Number or Range
            if (token.type() == Token::Type::Operand && token.subtype() == Token::Subtype::None)
            {
                if (std::regex_match(&formula[token.start()], &formula[token.end()]+1, number_re))
                {
                    token.subtype(Token::Subtype::Number);
                }
                else
                {
                    token.subtype(Token::Subtype::Range);
                }
            }
        }
    }